

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

ParameterError GetSizeParameter(GlobalConfig *global,char *arg,char *which,curl_off_t *value_out)

{
  CURLofft CVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  curl_off_t value;
  char *unit;
  
  CVar1 = curlx_strtoofft(arg,&unit,0,&value);
  if (CVar1 != CURL_OFFT_OK) {
    pcVar4 = "invalid number specified for %s\n";
    goto LAB_00112511;
  }
  cVar3 = *unit;
  if (cVar3 == '\0') {
    pcVar4 = "$b";
LAB_0011254e:
    unit = pcVar4 + 1;
    cVar3 = *unit;
  }
  else {
    sVar2 = strlen(unit);
    if (1 < sVar2) {
      pcVar4 = "$w";
      goto LAB_0011254e;
    }
  }
  if (cVar3 == 'B') goto LAB_001125eb;
  if (cVar3 == 'G') {
LAB_00112587:
    if (0x1ffffffff < value) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    value = value << 0x1e;
    goto LAB_001125eb;
  }
  if (cVar3 == 'K') {
LAB_001125a1:
    if (0x1fffffffffffff < value) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    value = value << 10;
  }
  else {
    if (cVar3 != 'M') {
      if (cVar3 == 'b') goto LAB_001125eb;
      if (cVar3 != 'm') {
        if (cVar3 != 'k') {
          if (cVar3 != 'g') {
            pcVar4 = "unsupported %s unit. Use G, M, K or B!\n";
LAB_00112511:
            warnf(global,pcVar4,which);
            return PARAM_BAD_USE;
          }
          goto LAB_00112587;
        }
        goto LAB_001125a1;
      }
    }
    if (0x7ffffffffff < value) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    value = value << 0x14;
  }
LAB_001125eb:
  *value_out = value;
  return PARAM_OK;
}

Assistant:

static ParameterError GetSizeParameter(struct GlobalConfig *global,
                                       const char *arg,
                                       const char *which,
                                       curl_off_t *value_out)
{
  char *unit;
  curl_off_t value;

  if(curlx_strtoofft(arg, &unit, 0, &value)) {
    warnf(global, "invalid number specified for %s\n", which);
    return PARAM_BAD_USE;
  }

  if(!*unit)
    unit = (char *)"b";
  else if(strlen(unit) > 1)
    unit = (char *)"w"; /* unsupported */

  switch(*unit) {
  case 'G':
  case 'g':
    if(value > (CURL_OFF_T_MAX / (1024*1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024*1024;
    break;
  case 'M':
  case 'm':
    if(value > (CURL_OFF_T_MAX / (1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024;
    break;
  case 'K':
  case 'k':
    if(value > (CURL_OFF_T_MAX / 1024))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024;
    break;
  case 'b':
  case 'B':
    /* for plain bytes, leave as-is */
    break;
  default:
    warnf(global, "unsupported %s unit. Use G, M, K or B!\n", which);
    return PARAM_BAD_USE;
  }
  *value_out = value;
  return PARAM_OK;
}